

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O2

void __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ofb>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
::
evp_cipher_context<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ofb>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
           *this,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 key_first,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          key_last,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   iv_first,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          iv_last)

{
  int iVar1;
  size_t sVar2;
  EVP_CIPHER_CTX *pEVar3;
  EVP_CIPHER *cipher;
  uint8_t iv [16];
  uint8_t key [64];
  uchar auStack_c8 [24];
  source_location local_b0;
  evp_error local_98;
  uchar local_68 [64];
  
  sVar2 = symmetric_algorithm<&EVP_des_ofb>::block_size();
  *(size_t *)(this + 8) = sVar2;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  if ((long)key_last._M_current - (long)key_first._M_current != 0) {
    memcpy(local_68,key_first._M_current,(long)key_last._M_current - (long)key_first._M_current);
  }
  if ((long)iv_last._M_current - (long)iv_first._M_current != 0) {
    memcpy(auStack_c8,iv_first._M_current,(long)iv_last._M_current - (long)iv_first._M_current);
  }
  pEVar3 = EVP_CIPHER_CTX_new();
  *(EVP_CIPHER_CTX **)this = pEVar3;
  cipher = EVP_des_ofb();
  iVar1 = EVP_DecryptInit_ex(*(EVP_CIPHER_CTX **)this,cipher,(ENGINE *)0x0,local_68,auStack_c8);
  if (iVar1 == 1) {
    return;
  }
  local_98._32_8_ = 0;
  local_98._16_8_ = 0;
  local_98._24_8_ = 0;
  local_98._40_8_ = 0xffffffff;
  local_98._0_8_ = 0x2b7668;
  local_98._8_8_ = 0x2b7698;
  local_b0.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/include/cryptox/symmetric/basic_endec.hxx"
  ;
  local_b0.function_ =
       "cryptox::evp_cipher_context<cryptox::symmetric_algorithm<&EVP_des_ofb>, &EVP_DecryptInit_ex, &EVP_DecryptUpdate, &EVP_DecryptFinal_ex>::evp_cipher_context(KeyInput, KeyInput, IVInput, IVInput) [Algorithm = cryptox::symmetric_algorithm<&EVP_des_ofb>, InitFx = &EVP_DecryptInit_ex, UpdateFx = &EVP_DecryptUpdate, FinalFx = &EVP_DecryptFinal_ex, KeyInput = __gnu_cxx::__normal_iterator<const unsigned char *, std::vector<unsigned char>>, IVInput = __gnu_cxx::__normal_iterator<const unsigned char *, std::vector<unsigned char>>]"
  ;
  local_b0.line_ = 0x3b;
  local_b0.column_ = 0;
  boost::throw_exception<cryptox::evp_error>(&local_98,&local_b0);
}

Assistant:

evp_cipher_context(KeyInput key_first, KeyInput key_last,
		                    IVInput  iv_first,  IVInput  iv_last)
		 : _total_input(0),
		   _total_output(0) {
			std::uint8_t key[EVP_MAX_KEY_LENGTH];
			std::copy(key_first, key_last, key);

			std::uint8_t iv[EVP_MAX_IV_LENGTH];
			std::copy(iv_first, iv_last, iv);

			_context = EVP_CIPHER_CTX_new();

			const EVP_CIPHER* cipher = Algorithm::cipher();
			if (InitFx(_context, cipher, 0, key, iv) != 1)
				BOOST_THROW_EXCEPTION(evp_error());
		}